

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<const_short_&,_const_short_&>::streamReconstructedExpression
          (BinaryExpr<const_short_&,_const_short_&> *this,ostream *os)

{
  StringRef SVar1;
  type local_60;
  type local_40;
  
  StringMaker<short,_void>::convert<short>(&local_40,this->m_lhs);
  SVar1 = this->m_op;
  StringMaker<short,_void>::convert<short>(&local_60,this->m_rhs);
  Catch::formatReconstructedExpression(os,(string *)&local_40,SVar1,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }